

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixNormalsStep.cpp
# Opt level: O0

void __thiscall
Assimp::FixInfacingNormalsProcess::Execute(FixInfacingNormalsProcess *this,aiScene *pScene)

{
  bool bVar1;
  bool bVar2;
  Logger *pLVar3;
  uint local_20;
  uint a;
  bool bHas;
  aiScene *pScene_local;
  FixInfacingNormalsProcess *this_local;
  
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"FixInfacingNormalsProcess begin");
  bVar1 = false;
  for (local_20 = 0; local_20 < pScene->mNumMeshes; local_20 = local_20 + 1) {
    bVar2 = ProcessMesh(this,pScene->mMeshes[local_20],local_20);
    if (bVar2) {
      bVar1 = true;
    }
  }
  if (bVar1) {
    pLVar3 = DefaultLogger::get();
    Logger::debug(pLVar3,"FixInfacingNormalsProcess finished. Found issues.");
  }
  else {
    pLVar3 = DefaultLogger::get();
    Logger::debug(pLVar3,"FixInfacingNormalsProcess finished. No changes to the scene.");
  }
  return;
}

Assistant:

void FixInfacingNormalsProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("FixInfacingNormalsProcess begin");

    bool bHas( false );
    for (unsigned int a = 0; a < pScene->mNumMeshes; ++a) {
        if (ProcessMesh(pScene->mMeshes[a], a)) {
            bHas = true;
        }
    }

    if (bHas) {
        ASSIMP_LOG_DEBUG("FixInfacingNormalsProcess finished. Found issues.");
    } else {
        ASSIMP_LOG_DEBUG("FixInfacingNormalsProcess finished. No changes to the scene.");
    }
}